

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly_from_poly2(poly *out,poly2 *in)

{
  uint local_34;
  ulong uStack_30;
  uint i;
  crypto_word_t word;
  crypto_word_t *pcStack_20;
  uint shift;
  crypto_word_t *words;
  poly2 *in_local;
  poly *out_local;
  
  word._4_4_ = 0;
  uStack_30 = in->v[0];
  local_34 = 0;
  pcStack_20 = in->v;
  for (; local_34 < 0x2bd; local_34 = local_34 + 1) {
    (out->field_0).v[local_34] = (ushort)uStack_30 & 1;
    uStack_30 = uStack_30 >> 1;
    word._4_4_ = word._4_4_ + 1;
    if (word._4_4_ == 0x40) {
      pcStack_20 = pcStack_20 + 1;
      uStack_30 = *pcStack_20;
      word._4_4_ = 0;
    }
  }
  poly_normalize(out);
  return;
}

Assistant:

static void poly_from_poly2(struct poly *out, const struct poly2 *in) {
  const crypto_word_t *words = in->v;
  unsigned shift = 0;
  crypto_word_t word = *words;

  for (unsigned i = 0; i < N; i++) {
    out->v[i] = word & 1;
    word >>= 1;
    shift++;

    if (shift == BITS_PER_WORD) {
      words++;
      word = *words;
      shift = 0;
    }
  }

  poly_normalize(out);
}